

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_plastic.cxx
# Opt level: O0

void shade_round(int x,int y,int w,int h,char *c,Fl_Color bc)

{
  int iVar1;
  int iVar2;
  Fl_Color FVar3;
  uchar *puVar4;
  size_t sVar5;
  int local_48;
  int na_1;
  int d_1;
  int na;
  int d;
  int chalf;
  int clen;
  int i;
  uchar *g;
  Fl_Color bc_local;
  char *c_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  puVar4 = fl_gray_ramp();
  sVar5 = strlen(c);
  iVar1 = (int)sVar5 + -1;
  iVar2 = iVar1 / 2;
  c_local._0_4_ = h;
  c_local._4_4_ = w;
  h_local = y;
  w_local = x;
  if (h < w) {
    d_1 = h / 2;
    for (chalf = 0; chalf < iVar2; chalf = chalf + 1) {
      FVar3 = shade_color(puVar4[(int)c[chalf]],bc);
      fl_color(FVar3);
      fl_pie(w_local,h_local,(int)c_local,(int)c_local,90.0,(double)(chalf << 3) + 135.0);
      fl_xyline(w_local + d_1,h_local,(w_local + c_local._4_4_) - d_1);
      fl_pie((w_local + c_local._4_4_) - (int)c_local,h_local,(int)c_local,(int)c_local,
             (double)(chalf << 3) + 45.0,90.0);
      FVar3 = shade_color(puVar4[c[chalf] + -2],bc);
      fl_color(FVar3);
      fl_pie((w_local + c_local._4_4_) - (int)c_local,h_local,(int)c_local,(int)c_local,
             (double)(chalf << 3) + 315.0,(double)(chalf << 3) + 405.0);
      FVar3 = shade_color(puVar4[(int)c[iVar1 - chalf]],bc);
      fl_color(FVar3);
      fl_pie((w_local + c_local._4_4_) - (int)c_local,h_local,(int)c_local,(int)c_local,270.0,
             (double)(chalf << 3) + 315.0);
      fl_xyline(w_local + d_1,h_local + (int)c_local + -1,(w_local + c_local._4_4_) - d_1);
      fl_pie(w_local,h_local,(int)c_local,(int)c_local,(double)(chalf << 3) + 225.0,270.0);
      FVar3 = shade_color(puVar4[c[iVar1 - chalf] + -2],bc);
      fl_color(FVar3);
      fl_pie(w_local,h_local,(int)c_local,(int)c_local,(double)(chalf << 3) + 135.0,
             (double)(chalf << 3) + 225.0);
      d_1 = d_1 + -1;
      w_local = w_local + 1;
      h_local = h_local + 1;
      c_local._4_4_ = c_local._4_4_ + -2;
      c_local._0_4_ = (int)c_local + -2;
    }
    FVar3 = shade_color(puVar4[(int)c[iVar2]],bc);
    fl_color(FVar3);
    fl_rectf(w_local + d_1,h_local,(c_local._4_4_ - (int)c_local) + 1,(int)c_local + 1);
    fl_pie(w_local,h_local,(int)c_local,(int)c_local,90.0,270.0);
    fl_pie((w_local + c_local._4_4_) - (int)c_local,h_local,(int)c_local,(int)c_local,270.0,90.0);
  }
  else {
    local_48 = w / 2;
    for (chalf = 0; chalf < iVar2; chalf = chalf + 1) {
      FVar3 = shade_color(puVar4[(int)c[chalf]],bc);
      fl_color(FVar3);
      fl_pie(w_local,h_local,c_local._4_4_,c_local._4_4_,(double)(chalf << 3) + 45.0,
             (double)(chalf << 3) + 135.0);
      FVar3 = shade_color(puVar4[c[chalf] + -2],bc);
      fl_color(FVar3);
      fl_pie(w_local,h_local,c_local._4_4_,c_local._4_4_,0.0,(double)(chalf << 3) + 45.0);
      fl_yxline(w_local + c_local._4_4_ + -1,h_local + local_48,(h_local + (int)c_local) - local_48)
      ;
      fl_pie(w_local,(h_local + (int)c_local) - c_local._4_4_,c_local._4_4_,c_local._4_4_,
             (double)(chalf << 3) + 315.0,360.0);
      FVar3 = shade_color(puVar4[(int)c[iVar1 - chalf]],bc);
      fl_color(FVar3);
      fl_pie(w_local,(h_local + (int)c_local) - c_local._4_4_,c_local._4_4_,c_local._4_4_,
             (double)(chalf << 3) + 225.0,(double)(chalf << 3) + 315.0);
      FVar3 = shade_color(puVar4[c[iVar1 - chalf] + -2],bc);
      fl_color(FVar3);
      fl_pie(w_local,(h_local + (int)c_local) - c_local._4_4_,c_local._4_4_,c_local._4_4_,180.0,
             (double)(chalf << 3) + 225.0);
      fl_yxline(w_local,h_local + local_48,(h_local + (int)c_local) - local_48);
      fl_pie(w_local,h_local,c_local._4_4_,c_local._4_4_,(double)(chalf << 3) + 135.0,180.0);
      local_48 = local_48 + -1;
      w_local = w_local + 1;
      h_local = h_local + 1;
      c_local._4_4_ = c_local._4_4_ + -2;
      c_local._0_4_ = (int)c_local + -2;
    }
    FVar3 = shade_color(puVar4[(int)c[iVar2]],bc);
    fl_color(FVar3);
    fl_rectf(w_local,h_local + local_48,c_local._4_4_ + 1,((int)c_local - c_local._4_4_) + 1);
    fl_pie(w_local,h_local,c_local._4_4_,c_local._4_4_,0.0,180.0);
    fl_pie(w_local,(h_local + (int)c_local) - c_local._4_4_,c_local._4_4_,c_local._4_4_,180.0,360.0)
    ;
  }
  return;
}

Assistant:

static void shade_round(int x, int y, int w, int h, const char *c, Fl_Color bc) {
  const uchar *g = fl_gray_ramp();
  int	i;
  int 	clen = (int) (strlen(c) - 1);
  int 	chalf = clen / 2;

  if (w>h) {
    int d = h/2;
    const int na = 8;
    for (i=0; i<chalf; i++, d--, x++, y++, w-=2, h-=2)
    {
      fl_color(shade_color(g[(int)c[i]], bc));
      fl_pie(x, y, h, h, 90.0, 135.0+i*na);
      fl_xyline(x+d, y, x+w-d);
      fl_pie(x+w-h, y, h, h, 45.0+i*na, 90.0);
      fl_color(shade_color(g[(int)c[i] - 2], bc));
      fl_pie(x+w-h, y, h, h, 315.0+i*na, 405.0+i*na);
      fl_color(shade_color(g[(int)c[clen - i]], bc));
      fl_pie(x+w-h, y, h, h, 270.0, 315.0+i*na);
      fl_xyline(x+d, y+h-1, x+w-d);
      fl_pie(x, y, h, h, 225.0+i*na, 270.0);
      fl_color(shade_color(g[c[(int)clen - i] - 2], bc));
      fl_pie(x, y, h, h, 135.0+i*na, 225.0+i*na);
    }
    fl_color(shade_color(g[(int)c[chalf]], bc));
    fl_rectf(x+d, y, w-h+1, h+1);
    fl_pie(x, y, h, h, 90.0, 270.0);
    fl_pie(x+w-h, y, h, h, 270.0, 90.0);
  } else {
    int d = w/2;
    const int na = 8;
    for (i=0; i<chalf; i++, d--, x++, y++, w-=2, h-=2)
    {
      fl_color(shade_color(g[(int)c[i]], bc));
      fl_pie(x, y, w, w, 45.0+i*na, 135.0+i*na);
      fl_color(shade_color(g[c[i] - 2], bc));
      fl_pie(x, y, w, w, 0.0, 45.0+i*na);
      fl_yxline(x+w-1, y+d, y+h-d);
      fl_pie(x, y+h-w, w, w, 315.0+i*na, 360.0);
      fl_color(shade_color(g[(int)c[clen - i]], bc));
      fl_pie(x, y+h-w, w, w, 225.0+i*na, 315.0+i*na);
      fl_color(shade_color(g[c[clen - i] - 2], bc));
      fl_pie(x, y+h-w, w, w, 180.0, 225.0+i*na);
      fl_yxline(x, y+d, y+h-d);
      fl_pie(x, y, w, w, 135.0+i*na, 180.0);
    }
    fl_color(shade_color(g[(int)c[chalf]], bc));
    fl_rectf(x, y+d, w+1, h-w+1);
    fl_pie(x, y, w, w, 0.0, 180.0);
    fl_pie(x, y+h-w, w, w, 180.0, 360.0);
  }
}